

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_strex.cc
# Opt level: O3

int ASN1_STRING_to_UTF8(uchar **out,ASN1_STRING *in)

{
  int inform;
  int iVar1;
  ASN1_STRING *str;
  ASN1_STRING *local_38;
  ASN1_STRING local_30;
  
  iVar1 = -1;
  if (in != (ASN1_STRING *)0x0) {
    inform = string_type_to_encoding(in->type);
    if (inform == -1) {
      ERR_put_error(0xc,0,0xb9,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/a_strex.cc"
                    ,0x147);
    }
    else {
      local_38 = &local_30;
      local_30.length = 0;
      local_30.data = (uchar *)0x0;
      local_30.flags = 0;
      iVar1 = ASN1_mbstring_copy(&local_38,in->data,in->length,inform,0x2000);
      if (-1 < iVar1) {
        *out = local_30.data;
        iVar1 = local_30.length;
      }
    }
  }
  return iVar1;
}

Assistant:

int ASN1_STRING_to_UTF8(unsigned char **out, const ASN1_STRING *in) {
  if (!in) {
    return -1;
  }
  int mbflag = string_type_to_encoding(in->type);
  if (mbflag == -1) {
    OPENSSL_PUT_ERROR(ASN1, ASN1_R_UNKNOWN_TAG);
    return -1;
  }
  ASN1_STRING stmp, *str = &stmp;
  stmp.data = NULL;
  stmp.length = 0;
  stmp.flags = 0;
  int ret =
      ASN1_mbstring_copy(&str, in->data, in->length, mbflag, B_ASN1_UTF8STRING);
  if (ret < 0) {
    return ret;
  }
  *out = stmp.data;
  return stmp.length;
}